

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O3

LY_ERR lysp_stmt_refine(lysp_ctx *ctx,lysp_stmt *stmt,lysp_refine **refines)

{
  lysp_ext_instance **exts;
  long *plVar1;
  ly_stmt stmt_00;
  lysp_refine *plVar2;
  lyd_node *plVar3;
  int iVar4;
  LY_ERR LVar5;
  long *plVar6;
  long lVar7;
  char *pcVar8;
  char *format;
  uint32_t substmt_index;
  lysp_qname **qnames;
  ly_ctx *plVar9;
  lysp_ext_instance **in_R8;
  lysp_ext_instance **in_R9;
  lysp_stmt *stmt_01;
  uint16_t *flags;
  
  LVar5 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
  plVar2 = *refines;
  if (plVar2 == (lysp_refine *)0x0) {
    plVar6 = (long *)malloc(0x58);
    if (plVar6 == (long *)0x0) goto LAB_0016e35f;
    *plVar6 = 1;
    lVar7 = 1;
  }
  else {
    lVar7 = *(long *)&plVar2[-1].flags;
    *(long *)&plVar2[-1].flags = lVar7 + 1;
    plVar6 = (long *)realloc(&plVar2[-1].flags,lVar7 * 0x50 + 0x58);
    if (plVar6 == (long *)0x0) {
      *(long *)&(*refines)[-1].flags = *(long *)&(*refines)[-1].flags + -1;
LAB_0016e35f:
      if (ctx == (lysp_ctx *)0x0) {
        plVar9 = (ly_ctx *)0x0;
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar9,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_refine");
      return LY_EMEM;
    }
    lVar7 = *plVar6;
  }
  *refines = (lysp_refine *)(plVar6 + 1);
  plVar1 = plVar6 + lVar7 * 10;
  plVar1[-1] = 0;
  *plVar1 = 0;
  plVar1[-3] = 0;
  plVar1[-2] = 0;
  plVar1[-5] = 0;
  plVar1[-4] = 0;
  plVar1[-7] = 0;
  plVar1[-6] = 0;
  plVar1[-9] = 0;
  plVar1[-8] = 0;
  if (ctx == (lysp_ctx *)0x0) {
    plVar9 = (ly_ctx *)0x0;
  }
  else {
    plVar9 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  LVar5 = lydict_insert(plVar9,stmt->arg,0,(char **)(plVar1 + -9));
  if ((LVar5 == LY_SUCCESS) &&
     (stmt_01 = stmt->child, LVar5 = LY_SUCCESS, stmt_01 != (lysp_stmt *)0x0)) {
    flags = (uint16_t *)(plVar6 + lVar7 * 10);
    exts = (lysp_ext_instance **)(flags + -4);
    iVar4 = (int)flags;
    do {
      stmt_00 = stmt_01->kw;
      if ((int)stmt_00 < 0x180000) {
        if ((int)stmt_00 < 0x80000) {
          if (stmt_00 == LY_STMT_CONFIG) {
            LVar5 = lysp_stmt_config(ctx,stmt_01,flags,exts);
          }
          else {
            qnames = (lysp_qname **)(flags + -0xc);
            if (stmt_00 != LY_STMT_DEFAULT) goto LAB_0016e5ca;
LAB_0016e4ed:
            LVar5 = lysp_stmt_qnames(ctx,stmt_01,qnames,(yang_arg)exts,in_R8);
          }
        }
        else {
          substmt_index = iVar4 - 0x40;
          if (stmt_00 == LY_STMT_DESCRIPTION) goto LAB_0016e541;
          if (stmt_00 != LY_STMT_EXTENSION_INSTANCE) {
            if (stmt_00 == LY_STMT_IF_FEATURE) {
              plVar3 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
              qnames = (lysp_qname **)(flags + -0x18);
              if (*(byte *)&plVar3[2].schema < 2) {
                plVar9 = (ly_ctx *)**(undefined8 **)plVar3;
                format = 
                "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
                ;
                pcVar8 = "if-feature";
                goto LAB_0016e62e;
              }
              goto LAB_0016e4ed;
            }
LAB_0016e5ca:
            if (ctx == (lysp_ctx *)0x0) {
              plVar9 = (ly_ctx *)0x0;
            }
            else {
              plVar9 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar8 = lyplg_ext_stmt2str(stmt_00);
            format = "Invalid keyword \"%s\" as a child of \"%s\".";
LAB_0016e62e:
            ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar8,"refine");
            return LY_EVALID;
          }
          in_R8 = exts;
          LVar5 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_REFINE,0,exts);
        }
      }
      else if ((int)stmt_00 < 0x1d0000) {
        if (stmt_00 == LY_STMT_MANDATORY) {
          LVar5 = lysp_stmt_mandatory(ctx,stmt_01,flags,exts);
        }
        else if (stmt_00 == LY_STMT_MAX_ELEMENTS) {
          in_R8 = exts;
          LVar5 = lysp_stmt_maxelements(ctx,stmt_01,(uint32_t *)(flags + -6),flags,exts);
        }
        else {
          if (stmt_00 != LY_STMT_MIN_ELEMENTS) goto LAB_0016e5ca;
          in_R8 = exts;
          LVar5 = lysp_stmt_minelements(ctx,stmt_01,(uint32_t *)(flags + -8),flags,exts);
        }
      }
      else if (stmt_00 == LY_STMT_MUST) {
        LVar5 = lysp_stmt_restrs(ctx,stmt_01,(lysp_restr **)(flags + -0x14));
      }
      else {
        substmt_index = iVar4 - 0x20;
        if ((stmt_00 != LY_STMT_PRESENCE) &&
           (substmt_index = iVar4 - 0x38, stmt_00 != LY_STMT_REFERENCE)) goto LAB_0016e5ca;
LAB_0016e541:
        in_R8 = exts;
        LVar5 = lysp_stmt_text_field(ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
      }
      if (LVar5 != LY_SUCCESS) {
        return LVar5;
      }
      stmt_01 = stmt_01->next;
      LVar5 = LY_SUCCESS;
    } while (stmt_01 != (lysp_stmt *)0x0);
  }
  return LVar5;
}

Assistant:

static LY_ERR
lysp_stmt_refine(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_refine **refines)
{
    struct lysp_refine *rf;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *refines, rf, LY_EMEM);

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &rf->nodeid));

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &rf->flags, &rf->exts));
            break;
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &rf->dflts, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &rf->dsc, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_IF_FEATURE:
            PARSER_CHECK_STMTVER2_RET(ctx, "if-feature", "refine");
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &rf->iffeatures, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_maxelements(ctx, child, &rf->max, &rf->flags, &rf->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_minelements(ctx, child, &rf->min, &rf->flags, &rf->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &rf->musts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(lysp_stmt_mandatory(ctx, child, &rf->flags, &rf->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &rf->ref, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_PRESENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &rf->presence, Y_STR_ARG, &rf->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_REFINE, 0, &rf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "refine");
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}